

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

void __thiscall glslang::TType::TType(TType *this,TBasicType t,TType *p,TString *n)

{
  undefined1 *puVar1;
  TPoolAllocator *this_00;
  TString *this_01;
  anon_union_8_2_8ac53c11_for_TType_13 aVar2;
  ulong uVar3;
  void *__child_stack;
  __fn *__fn;
  void *in_R8;
  pool_allocator<char> local_28;
  undefined4 extraout_var;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_00923160;
  *(TBasicType *)&this->field_0x8 = (*(uint *)&this->field_0x8 & 0xf8000000) + (t & 0xff) + 0x100;
  this->arraySizes = (TArraySizes *)0x0;
  (this->field_13).structure = (TTypeList *)0x0;
  this->fieldName = (TString *)0x0;
  this->typeName = (TString *)0x0;
  this->typeParameters = (TTypeParameters *)0x0;
  this->spirvType = (TSpirvType *)0x0;
  if (t == EbtReference) {
    __fn = (__fn *)(n->_M_dataplus)._M_p;
    this_00 = GetThreadPoolAllocator();
    this_01 = (TString *)TPoolAllocator::allocate(this_00,0x28);
    local_28.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)this_01,
               (char *)__fn,&local_28);
    this->typeName = this_01;
    this->sampler = (TSampler)((uint)this->sampler & 0x80000000 | 0x1f000000);
    puVar1 = &(this->qualifier).field_0xb;
    *puVar1 = *puVar1 & 0xe1;
    TQualifier::makeTemporary(&this->qualifier);
    uVar3 = *(ulong *)&(this->qualifier).field_0x8;
    *(ulong *)&(this->qualifier).field_0x8 = uVar3 & 0xe3ffffe7fe00ffff;
    __child_stack = (void *)(ulong)((uint)*(undefined8 *)&(p->qualifier).field_0x8 & 0x7f);
    uVar3 = uVar3 & 0xe3ffffe7fe00ff80 | (ulong)__child_stack;
    *(ulong *)&(this->qualifier).field_0x8 = uVar3;
    aVar2._0_4_ = clone(p,__fn,__child_stack,(int)uVar3,in_R8);
    aVar2._4_4_ = extraout_var;
    this->field_13 = aVar2;
    return;
  }
  __assert_fail("t == EbtReference",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x6bc,"glslang::TType::TType(TBasicType, const TType &, const TString &)");
}

Assistant:

explicit TType(TBasicType t, const TType &p, const TString& n) :
                            basicType(t), vectorSize(1), matrixCols(0), matrixRows(0), vector1(false), coopmatNV(false), coopmatKHR(false), coopmatKHRuse(0), coopmatKHRUseValid(false),
                            arraySizes(nullptr), structure(nullptr), fieldName(nullptr), typeName(nullptr), typeParameters(nullptr),
                            spirvType(nullptr)
                            {
                                assert(t == EbtReference);
                                typeName = NewPoolTString(n.c_str());
                                sampler.clear();
                                qualifier.clear();
                                qualifier.storage = p.qualifier.storage;
                                referentType = p.clone();
                            }